

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void __thiscall QUndoStack::beginMacro(QUndoStack *this,QString *text)

{
  long lVar1;
  bool bVar2;
  QUndoStackPrivate *pQVar3;
  QUndoCommand *this_00;
  qsizetype qVar4;
  QUndoCommand *in_RDI;
  long in_FS_OFFSET;
  QUndoCommand *cmd;
  QUndoStackPrivate *d;
  value_type in_stack_ffffffffffffff88;
  QList<QUndoCommand_*> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QUndoStack *)0xa83e8f);
  this_00 = (QUndoCommand *)operator_new(0x10);
  QUndoCommand::QUndoCommand(this_00,in_RDI);
  QUndoCommand::setText(this_00,(QString *)in_RDI);
  bVar2 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa83ed9);
  if (bVar2) {
    while( true ) {
      in_stack_ffffffffffffff90 = (QList<QUndoCommand_*> *)(long)pQVar3->index;
      qVar4 = QList<QUndoCommand_*>::size(&pQVar3->command_list);
      if (qVar4 <= (long)in_stack_ffffffffffffff90) break;
      in_stack_ffffffffffffff88 = QList<QUndoCommand_*>::takeLast(in_stack_ffffffffffffff90);
      if (in_stack_ffffffffffffff88 != (value_type)0x0) {
        (*in_stack_ffffffffffffff88->_vptr_QUndoCommand[1])();
      }
    }
    if (pQVar3->index < pQVar3->clean_index) {
      pQVar3->clean_index = -1;
    }
    QList<QUndoCommand_*>::append((QList<QUndoCommand_*> *)0xa83f6e,in_stack_ffffffffffffff88);
  }
  else {
    QList<QUndoCommand_*>::constLast((QList<QUndoCommand_*> *)in_stack_ffffffffffffff88);
    QList<QUndoCommand_*>::append((QList<QUndoCommand_*> *)0xa83f92,in_stack_ffffffffffffff88);
  }
  QList<QUndoCommand_*>::append((QList<QUndoCommand_*> *)0xa83fa8,in_stack_ffffffffffffff88);
  qVar4 = QList<QUndoCommand_*>::size(&pQVar3->macro_stack);
  if (qVar4 == 1) {
    canUndoChanged((QUndoStack *)0xa83fcb,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
    QString::QString((QString *)0xa83fd5);
    undoTextChanged((QUndoStack *)in_stack_ffffffffffffff90,(QString *)in_stack_ffffffffffffff88);
    QString::~QString((QString *)0xa83fee);
    canRedoChanged((QUndoStack *)0xa83ffa,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
    QString::QString((QString *)0xa84004);
    redoTextChanged((QUndoStack *)in_stack_ffffffffffffff90,(QString *)in_stack_ffffffffffffff88);
    QString::~QString((QString *)0xa8401d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoStack::beginMacro(const QString &text)
{
    Q_D(QUndoStack);
    QUndoCommand *cmd = new QUndoCommand();
    cmd->setText(text);

    if (d->macro_stack.isEmpty()) {
        while (d->index < d->command_list.size())
            delete d->command_list.takeLast();
        if (d->clean_index > d->index)
            d->clean_index = -1; // we've deleted the clean state
        d->command_list.append(cmd);
    } else {
        d->macro_stack.constLast()->d->child_list.append(cmd);
    }
    d->macro_stack.append(cmd);

    if (d->macro_stack.size() == 1) {
        emit canUndoChanged(false);
        emit undoTextChanged(QString());
        emit canRedoChanged(false);
        emit redoTextChanged(QString());
    }
}